

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuronTest.cpp
# Opt level: O3

int main(void)

{
  double dVar1;
  Izhikevich_param *param;
  Event *e;
  Clock *pCVar2;
  ostream *poVar3;
  int iVar4;
  Izhikevich n;
  Izhikevich local_90;
  
  param = (Izhikevich_param *)operator_new(0x28);
  param->a = 0.02;
  param->b = 0.2;
  param->c = -65.0;
  param->d = 8.0;
  param->v_thres = 30.0;
  Izhikevich::Izhikevich(&local_90,0,0,param);
  e = (Event *)operator_new(0x18);
  e->_vptr_Event = (_func_int **)&PTR_setWeight_00106cd0;
  e->type = No;
  pCVar2 = Clock::getInstance();
  dVar1 = Clock::getCurrentTime(pCVar2);
  e->eventTime = dVar1;
  iVar4 = 0;
  do {
    if (iVar4 == 800) {
      e = (Event *)operator_new(0x18);
      e->_vptr_Event = (_func_int **)&PTR_setWeight_00106cd0;
      e->type = No;
      pCVar2 = Clock::getInstance();
      dVar1 = Clock::getCurrentTime(pCVar2);
      e->eventTime = dVar1;
    }
    else if (iVar4 == 500) {
      e = (Event *)operator_new(0x28);
      e->_vptr_Event = (_func_int **)&PTR_setWeight_00106d20;
      *(undefined4 *)&e[1]._vptr_Event = 1;
      *(undefined8 *)&e[1].type = 0x3ff0000000000000;
      e->type = Spike;
      pCVar2 = Clock::getInstance();
      dVar1 = Clock::getCurrentTime(pCVar2);
      e->eventTime = dVar1;
      *(undefined4 *)&e[1]._vptr_Event = 1;
      *(undefined8 *)&e[1].type = 0x3ff0000000000000;
    }
    Izhikevich::handleEvent(&local_90,e);
    Izhikevich::update(&local_90,0.3);
    dVar1 = Izhikevich::getMembranePotential(&local_90);
    poVar3 = std::ostream::_M_insert<double>(dVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    Izhikevich::resetInput(&local_90);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x514);
  Izhikevich::~Izhikevich(&local_90);
  return 0;
}

Assistant:

int main() 
{
    Izhikevich_param* p = new Izhikevich_param();
    Izhikevich n = Izhikevich(0, 0, p);
    Event* e = new NoEvent();

    for(int i = 0; i < 1300; i++) {
        if(i == 500) {
            e = new SpikeEvent();
            static_cast<SpikeEvent*>(e)->multiplicity = 1;
            static_cast<SpikeEvent*>(e)->weight = 1.0;
        }
        else if(i == 800) {
            e = new NoEvent();
        }

        n.handleEvent(e);
        n.update(0.3);
        cout << n.getMembranePotential() << endl;
        n.resetInput();
    }
    return 0;
}